

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O0

void __thiscall
antlr::MismatchedTokenException::MismatchedTokenException
          (MismatchedTokenException *this,char **tokenNames_,int numTokens_,RefAST *node_,int lower,
          int upper_,bool matchNot)

{
  AST *pAVar1;
  ASTRefCount *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  byte in_stack_00000008;
  Token *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string *in_stack_ffffffffffffff38;
  RecognitionException *in_stack_ffffffffffffff40;
  allocator<char> *in_stack_ffffffffffffff50;
  allocator<char> *__a;
  uint nbits;
  undefined5 in_stack_ffffffffffffff70;
  byte bVar3;
  undefined2 in_stack_ffffffffffffff76;
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [39];
  byte local_29;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_14;
  undefined8 local_10;
  
  local_29 = in_stack_00000008 & 1;
  nbits = (uint)((ulong)&local_51 >> 0x20);
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,(char *)in_RCX,in_stack_ffffffffffffff50);
  __a = (allocator<char> *)&stack0xffffffffffffff77;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)in_RCX,__a);
  RecognitionException::RecognitionException
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  *(undefined ***)in_RDI = &PTR__MismatchedTokenException_00505b38;
  TokenRefCount<antlr::Token>::TokenRefCount
            ((TokenRefCount<antlr::Token> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  ASTRefCount<antlr::AST>::ASTRefCount
            ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff30,
             (ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff28);
  pbVar2 = in_RDI + 3;
  bVar3 = 0;
  pAVar1 = ASTRefCount::operator_cast_to_AST_(in_RCX);
  if (pAVar1 == (AST *)0x0) {
    std::allocator<char>::allocator();
    bVar3 = 1;
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)in_RCX,__a);
  }
  else {
    pAVar1 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RCX);
    (*pAVar1->_vptr_AST[0x18])(pbVar2);
  }
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff76);
  }
  *(uint *)(in_RDI + 4) = (local_29 & 1) + 3;
  *(undefined4 *)&in_RDI[4].field_0x4 = local_24;
  *(undefined4 *)&in_RDI[4]._M_string_length = local_28;
  BitSet::BitSet((BitSet *)
                 CONCAT26(in_stack_ffffffffffffff76,CONCAT15(bVar3,in_stack_ffffffffffffff70)),nbits
                );
  *(undefined8 *)((long)&in_RDI[5].field_2 + 8) = local_10;
  *(undefined4 *)(in_RDI + 6) = local_14;
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException(
	const char* const* tokenNames_,
	const int numTokens_,
	RefAST node_,
	int lower,
	int upper_,
	bool matchNot
) : RecognitionException("Mismatched Token","<AST>",-1,-1)
  , token(0)
  , node(node_)
  , tokenText( (node_ ? node_->toString(): ANTLR_USE_NAMESPACE(std)string("<empty tree>")) )
  , mismatchType(matchNot ? NOT_RANGE : RANGE)
  , expecting(lower)
  , upper(upper_)
  , tokenNames(tokenNames_)
  , numTokens(numTokens_)
{
}